

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O0

int lj_cf_buffer_method_putf(lua_State *L)

{
  SBufExt *sb;
  SBufExt *sbx;
  lua_State *L_local;
  SBufExt *sbx_1;
  
  sb = buffer_tobuf(L);
  (sb->L).ptr64 = (ulong)L | (sb->L).ptr64 & 7;
  lj_strfmt_putarg(L,(SBuf *)sb,2,2);
  L->top = L->base + 1;
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(buffer_method_putf)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobufw(L);
  lj_strfmt_putarg(L, (SBuf *)sbx, 2, 2);
  L->top = L->base+1;  /* Chain buffer object. */
  lj_gc_check(L);
  return 1;
}